

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# next_hit.cpp
# Opt level: O0

void __thiscall embree::Tutorial::drawGUI(Tutorial *this)

{
  undefined8 in_RDI;
  undefined4 in_stack_00000008;
  float in_stack_0000000c;
  float in_stack_00000010;
  float in_stack_00000014;
  float *in_stack_00000018;
  char *in_stack_00000020;
  bool *in_stack_00000130;
  char *in_stack_00000138;
  ImGuiSliderFlags flags;
  
  ImGui::Combo((char *)CONCAT44(in_stack_00000014,in_stack_00000010),
               (int *)CONCAT44(in_stack_0000000c,in_stack_00000008),(char **)this,
               (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  flags = (ImGuiSliderFlags)((ulong)in_RDI >> 0x20);
  if (g_next_hit_mode != 0) {
    ImGui::DragInt(in_stack_00000020,(int *)in_stack_00000018,in_stack_00000014,
                   (int)in_stack_00000010,(int)in_stack_0000000c,(char *)this,flags);
  }
  ImGui::DragInt(in_stack_00000020,(int *)in_stack_00000018,in_stack_00000014,(int)in_stack_00000010
                 ,(int)in_stack_0000000c,(char *)this,flags);
  ImGui::Checkbox(in_stack_00000138,in_stack_00000130);
  if ((g_enable_opacity & 1U) != 0) {
    ImGui::DragFloat(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000010,
                     in_stack_0000000c,(char *)this,flags);
  }
  if (g_next_hit_mode != 0) {
    ImGui::Checkbox(in_stack_00000138,in_stack_00000130);
  }
  return;
}

Assistant:

void drawGUI() override
    {
      
      ImGui::Combo("mode",&g_next_hit_mode,next_hit_mode_names,4);
      if (g_next_hit_mode != 0)
        ImGui::DragInt("max_next_hits",(int*)&g_max_next_hits,1.0f,1,16);
      ImGui::DragInt("max_total_hits",(int*)&g_max_total_hits,1.0f,1,128);
      ImGui::Checkbox("enable_opacity",&g_enable_opacity);
      if (g_enable_opacity)
        ImGui::DragFloat("curve_opacity",&g_curve_opacity,0.01f,0.0f,1.0f);
      if (g_next_hit_mode != 0)
        ImGui::Checkbox("verify",&g_verify);
    }